

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ztrsv.c
# Opt level: O3

void ztrsv_(char *uplo,char *trans,char *diag,integer *n,doublecomplex *a,integer *lda,
           doublecomplex *x,integer *incx)

{
  char cVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  doublecomplex *pdVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  doublecomplex *pdVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  int iVar22;
  doublecomplex *pdVar23;
  double in_XMM0_Qa;
  double dVar24;
  double dVar25;
  integer info;
  doublecomplex z__3;
  int local_e0;
  doublecomplex local_d8;
  int local_bc;
  doublecomplex local_b8;
  doublecomplex *local_a8;
  int *local_a0;
  doublecomplex local_98;
  doublecomplex *local_80;
  doublecomplex local_78;
  double *local_68;
  long local_60;
  uint *local_58;
  double *local_50;
  double *local_48;
  doublecomplex *local_40;
  ulong local_38;
  
  local_bc = 0;
  cVar1 = *uplo;
  if ((cVar1 == 'L') || (cVar1 == 'U')) {
    bVar2 = *trans;
    local_80 = (doublecomplex *)(ulong)bVar2;
    if ((bVar2 - 0x43 < 0x12) && ((0x20801U >> (bVar2 - 0x43 & 0x1f) & 1) != 0)) {
      cVar3 = *diag;
      if ((cVar3 == 'N') || (cVar3 == 'U')) {
        uVar4 = *n;
        uVar12 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          local_bc = 4;
        }
        else if (*lda < (int)(uVar4 + (uVar4 == 0))) {
          local_bc = 6;
        }
        else {
          iVar19 = *incx;
          if (iVar19 != 0) {
            if (uVar4 == 0) {
              return;
            }
            iVar22 = uVar4 - 1;
            iVar13 = iVar19 * iVar22;
            local_e0 = 1 - iVar13;
            if (0 < iVar19) {
              local_e0 = 1;
            }
            local_a8 = a;
            local_a0 = lda;
            local_58 = (uint *)n;
            if (bVar2 == 0x4e) {
              if (cVar1 != 'U') {
                if (iVar19 == 1) {
                  lVar8 = 0x10;
                  lVar9 = 0;
                  uVar15 = 1;
                  do {
                    lVar10 = uVar15 - 1;
                    pdVar18 = x + lVar10;
                    dVar24 = x[lVar10].r;
                    if (((dVar24 != 0.0) || (NAN(dVar24))) ||
                       ((pdVar18->i != 0.0 || (NAN(pdVar18->i))))) {
                      if (cVar3 == 'N') {
                        z_div(&local_d8,pdVar18,a + (int)lVar10 * (*lda + 1));
                        pdVar18->r = local_d8.r;
                        pdVar18->i = local_d8.i;
                        uVar12 = (ulong)(uint)*n;
                        a = local_a8;
                        lda = local_a0;
                        in_XMM0_Qa = local_98.r;
                        dVar24 = local_d8.r;
                        dVar25 = local_d8.i;
                      }
                      else {
                        dVar25 = pdVar18->i;
                      }
                      lVar10 = (long)(int)uVar12;
                      local_98.r = in_XMM0_Qa;
                      if ((long)uVar15 < lVar10) {
                        iVar19 = *lda;
                        uVar16 = uVar12;
                        lVar21 = lVar8;
                        do {
                          pdVar20 = (double *)((long)&a->r + lVar21 + iVar19 * lVar9);
                          dVar6 = *pdVar20;
                          dVar7 = pdVar20[1];
                          in_XMM0_Qa = dVar6 * dVar24 + dVar7 * -dVar25;
                          pdVar20 = (double *)((long)&x->r + lVar21);
                          local_d8.r = *pdVar20 - in_XMM0_Qa;
                          local_d8.i = pdVar20[1] - (dVar7 * dVar24 + dVar6 * dVar25);
                          pdVar20 = (double *)((long)&x->r + lVar21);
                          *pdVar20 = local_d8.r;
                          pdVar20[1] = local_d8.i;
                          lVar21 = lVar21 + 0x10;
                          uVar16 = uVar16 - 1;
                          local_98.r = in_XMM0_Qa;
                        } while (uVar15 != uVar16);
                      }
                    }
                    else {
                      lVar10 = (long)(int)uVar12;
                    }
                    lVar9 = lVar9 + 0x10;
                    lVar8 = lVar8 + 0x10;
                    bVar5 = (long)uVar15 < lVar10;
                    uVar15 = uVar15 + 1;
                  } while (bVar5);
                  return;
                }
                local_80 = x + -1;
                pdVar18 = a + 1;
                uVar15 = 1;
                iVar13 = 0;
                do {
                  lVar8 = (long)local_e0;
                  dVar24 = x[lVar8 + -1].r;
                  iVar22 = (int)uVar15;
                  if ((((dVar24 != 0.0) || (NAN(dVar24))) || (x[lVar8 + -1].i != 0.0)) ||
                     (NAN(x[lVar8 + -1].i))) {
                    if (cVar3 == 'N') {
                      z_div(&local_d8,x + lVar8 + -1,a + (*lda + 1) * (iVar22 + -1));
                      x[lVar8 + -1].r = local_d8.r;
                      x[lVar8 + -1].i = local_d8.i;
                      uVar12 = (ulong)*local_58;
                      iVar19 = *incx;
                      a = local_a8;
                      lda = local_a0;
                      in_XMM0_Qa = local_98.r;
                      dVar24 = local_d8.r;
                      dVar25 = local_d8.i;
                    }
                    else {
                      dVar25 = x[lVar8 + -1].i;
                    }
                    local_98.r = in_XMM0_Qa;
                    if (iVar22 < (int)uVar12) {
                      pdVar23 = local_80 + lVar8 + iVar19;
                      pdVar11 = pdVar18 + (long)iVar13 * (long)*lda;
                      uVar16 = uVar12;
                      do {
                        in_XMM0_Qa = pdVar11->r * dVar24 + pdVar11->i * -dVar25;
                        local_d8.r = pdVar23->r - in_XMM0_Qa;
                        local_d8.i = pdVar23->i - (pdVar11->i * dVar24 + pdVar11->r * dVar25);
                        pdVar23->r = local_d8.r;
                        pdVar23->i = local_d8.i;
                        pdVar23 = pdVar23 + iVar19;
                        pdVar11 = pdVar11 + 1;
                        uVar16 = uVar16 - 1;
                        local_98.r = in_XMM0_Qa;
                      } while (uVar15 != uVar16);
                    }
                  }
                  local_e0 = local_e0 + iVar19;
                  uVar15 = uVar15 + 1;
                  pdVar18 = pdVar18 + 1;
                  iVar13 = iVar13 + 1;
                } while (iVar22 < (int)uVar12);
                return;
              }
              if (iVar19 == 1) {
                lVar8 = uVar12 * 0x10;
                lVar9 = lVar8 + -0x20;
                pdVar18 = a;
                pdVar11 = x;
                do {
                  lVar8 = lVar8 + -0x10;
                  local_80 = (doublecomplex *)(uVar12 - 1);
                  pdVar23 = x + (long)local_80;
                  dVar24 = x[(long)local_80].r;
                  if ((((dVar24 != 0.0) || (NAN(dVar24))) || (pdVar23->i != 0.0)) ||
                     (NAN(pdVar23->i))) {
                    if (cVar3 == 'N') {
                      z_div(&local_d8,pdVar23,a + (int)local_80 * (*lda + 1));
                      pdVar23->r = local_d8.r;
                      pdVar23->i = local_d8.i;
                      a = local_a8;
                      lda = local_a0;
                      in_XMM0_Qa = local_98.r;
                      dVar24 = local_d8.r;
                      dVar25 = local_d8.i;
                    }
                    else {
                      dVar25 = pdVar23->i;
                    }
                    local_98.r = in_XMM0_Qa;
                    if (1 < uVar12) {
                      iVar19 = *lda;
                      lVar10 = lVar9;
                      uVar15 = uVar12;
                      do {
                        pdVar20 = (double *)((long)&pdVar18->r + lVar10 + iVar19 * lVar8);
                        dVar6 = *pdVar20;
                        dVar7 = pdVar20[1];
                        in_XMM0_Qa = dVar6 * dVar24 + dVar7 * -dVar25;
                        pdVar20 = (double *)((long)&pdVar11->r + lVar10);
                        local_d8.r = *pdVar20 - in_XMM0_Qa;
                        local_d8.i = pdVar20[1] - (dVar7 * dVar24 + dVar6 * dVar25);
                        pdVar20 = (double *)((long)&pdVar11->r + lVar10);
                        *pdVar20 = local_d8.r;
                        pdVar20[1] = local_d8.i;
                        uVar15 = uVar15 - 1;
                        lVar10 = lVar10 + -0x10;
                        local_98.r = in_XMM0_Qa;
                      } while (1 < (long)uVar15);
                    }
                  }
                  pdVar18 = pdVar18 + -1;
                  pdVar11 = pdVar11 + -1;
                  bVar5 = 1 < (long)uVar12;
                  uVar12 = (ulong)local_80;
                } while (bVar5);
                return;
              }
              local_e0 = local_e0 + iVar13;
              pdVar18 = a + (uVar12 - 2);
              do {
                lVar8 = (long)local_e0;
                dVar24 = x[lVar8 + -1].r;
                iVar13 = (int)uVar12;
                if (((dVar24 != 0.0) || (NAN(dVar24))) ||
                   ((x[lVar8 + -1].i != 0.0 || (NAN(x[lVar8 + -1].i))))) {
                  if (cVar3 == 'N') {
                    z_div(&local_d8,x + lVar8 + -1,a + (*lda + 1) * (iVar13 + -1));
                    x[lVar8 + -1].r = local_d8.r;
                    x[lVar8 + -1].i = local_d8.i;
                    iVar19 = *incx;
                    a = local_a8;
                    lda = local_a0;
                    in_XMM0_Qa = local_98.r;
                    dVar24 = local_d8.r;
                    dVar25 = local_d8.i;
                  }
                  else {
                    dVar25 = x[lVar8 + -1].i;
                  }
                  local_98.r = in_XMM0_Qa;
                  if (1 < iVar13) {
                    pdVar11 = pdVar18 + (long)iVar22 * (long)*lda;
                    iVar14 = local_e0 - iVar19;
                    uVar15 = uVar12;
                    do {
                      in_XMM0_Qa = pdVar11->r * dVar24 + pdVar11->i * -dVar25;
                      local_d8.r = x[(long)iVar14 + -1].r - in_XMM0_Qa;
                      local_d8.i = x[(long)iVar14 + -1].i -
                                   (pdVar11->i * dVar24 + pdVar11->r * dVar25);
                      x[(long)iVar14 + -1].r = local_d8.r;
                      x[(long)iVar14 + -1].i = local_d8.i;
                      uVar15 = uVar15 - 1;
                      pdVar11 = pdVar11 + -1;
                      iVar14 = iVar14 - iVar19;
                      local_98.r = in_XMM0_Qa;
                    } while (1 < (long)uVar15);
                  }
                }
                uVar12 = uVar12 - 1;
                local_e0 = local_e0 - iVar19;
                pdVar18 = pdVar18 + -1;
                iVar22 = iVar22 + -1;
              } while (1 < iVar13);
              return;
            }
            if (cVar1 != 'U') {
              if (iVar19 != 1) {
                local_e0 = local_e0 + iVar13;
                local_50 = &a[-1].i;
                pdVar20 = (double *)(uVar12 << 4);
                iVar13 = local_e0;
                do {
                  pdVar20 = (double *)((long)pdVar20 + -0x10);
                  local_60 = CONCAT44(local_60._4_4_,iVar13);
                  local_b8.r = x[(long)iVar13 + -1].r;
                  local_b8.i = x[(long)iVar13 + -1].i;
                  lVar8 = (long)*n;
                  if ((char)local_80 == 'T') {
                    if ((long)uVar12 < lVar8) {
                      pdVar17 = (double *)
                                ((long)local_50 + (long)*lda * (long)pdVar20 + lVar8 * 0x10);
                      iVar14 = local_e0;
                      do {
                        lVar8 = lVar8 + -1;
                        dVar24 = x[(long)iVar14 + -1].r;
                        dVar25 = x[(long)iVar14 + -1].i;
                        local_98.r = pdVar17[-1] * dVar24 + dVar25 * -*pdVar17;
                        local_98.i = pdVar17[-1] * dVar25 + dVar24 * *pdVar17;
                        local_b8.r = local_b8.r - local_98.r;
                        local_b8.i = local_b8.i - local_98.i;
                        iVar14 = iVar14 - iVar19;
                        pdVar17 = pdVar17 + -2;
                        local_d8.r = local_b8.r;
                        local_d8.i = local_b8.i;
                      } while ((long)uVar12 < lVar8);
                    }
                    if (cVar3 == 'N') {
                      pdVar18 = a + ((int)uVar12 + -1) * (*lda + 1);
LAB_0011bc3d:
                      z_div(&local_d8,&local_b8,pdVar18);
                      a = local_a8;
                      lda = local_a0;
                      local_b8.r = local_d8.r;
                      local_b8.i = local_d8.i;
                    }
                  }
                  else {
                    local_68 = pdVar20;
                    if ((long)uVar12 < lVar8) {
                      lVar8 = (long)(*n + -1);
                      iVar19 = local_e0;
                      do {
                        d_cnjg(&local_78,a + (long)iVar22 * (long)*lda + lVar8);
                        dVar24 = x[(long)iVar19 + -1].r;
                        dVar25 = x[(long)iVar19 + -1].i;
                        local_98.r = local_78.r * dVar24 + dVar25 * -local_78.i;
                        local_98.i = local_78.r * dVar25 + dVar24 * local_78.i;
                        local_b8.r = local_b8.r - local_98.r;
                        local_b8.i = local_b8.i - local_98.i;
                        iVar19 = iVar19 - *incx;
                        bVar5 = (long)uVar12 < lVar8;
                        lVar8 = lVar8 + -1;
                        a = local_a8;
                        lda = local_a0;
                        local_d8.r = local_b8.r;
                        local_d8.i = local_b8.i;
                      } while (bVar5);
                    }
                    n = (integer *)local_58;
                    pdVar20 = local_68;
                    if (cVar3 == 'N') {
                      d_cnjg(&local_98,a + ((int)uVar12 + -1) * (*lda + 1));
                      pdVar18 = &local_98;
                      goto LAB_0011bc3d;
                    }
                  }
                  x[(long)iVar13 + -1].r = local_b8.r;
                  x[(long)iVar13 + -1].i = local_b8.i;
                  iVar19 = *incx;
                  iVar13 = (int)local_60 - iVar19;
                  iVar22 = iVar22 + -1;
                  bVar5 = (long)uVar12 < 2;
                  uVar12 = uVar12 - 1;
                  if (bVar5) {
                    return;
                  }
                } while( true );
              }
              local_68 = &a[-1].i;
              lVar8 = uVar12 << 4;
              do {
                lVar8 = lVar8 + -0x10;
                uVar15 = uVar12 - 1;
                local_b8.r = x[uVar15].r;
                local_b8.i = x[uVar15].i;
                lVar9 = (long)*n;
                if ((char)local_80 == 'T') {
                  if ((long)uVar12 < lVar9) {
                    lVar10 = lVar9 << 4;
                    do {
                      lVar9 = lVar9 + -1;
                      dVar24 = *(double *)((long)local_68 + lVar10 + *lda * lVar8 + -8);
                      dVar25 = *(double *)((long)local_68 + lVar10 + *lda * lVar8);
                      pdVar20 = (double *)((long)&x[-1].r + lVar10);
                      dVar6 = *pdVar20;
                      dVar7 = pdVar20[1];
                      local_98.r = dVar24 * dVar6 + dVar7 * -dVar25;
                      local_98.i = dVar24 * dVar7 + dVar6 * dVar25;
                      local_b8.r = local_b8.r - local_98.r;
                      local_b8.i = local_b8.i - local_98.i;
                      lVar10 = lVar10 + -0x10;
                      local_d8.r = local_b8.r;
                      local_d8.i = local_b8.i;
                    } while ((long)uVar12 < lVar9);
                  }
                  if (cVar3 == 'N') {
                    pdVar18 = a + (int)uVar15 * (*lda + 1);
LAB_0011b447:
                    z_div(&local_d8,&local_b8,pdVar18);
                    a = local_a8;
                    lda = local_a0;
                    local_b8.r = local_d8.r;
                    local_b8.i = local_d8.i;
                  }
                }
                else {
                  local_60 = lVar8;
                  if ((long)uVar12 < lVar9) {
                    uVar16 = (long)(*n + -1);
                    do {
                      d_cnjg(&local_78,a + (long)*lda * (long)iVar22 + uVar16);
                      dVar24 = x[uVar16 & 0xffffffff].r;
                      dVar25 = x[uVar16 & 0xffffffff].i;
                      local_98.r = local_78.r * dVar24 + dVar25 * -local_78.i;
                      local_98.i = local_78.r * dVar25 + dVar24 * local_78.i;
                      local_b8.r = local_b8.r - local_98.r;
                      local_b8.i = local_b8.i - local_98.i;
                      bVar5 = (long)uVar12 < (long)uVar16;
                      a = local_a8;
                      lda = local_a0;
                      uVar16 = uVar16 - 1;
                      local_d8.r = local_b8.r;
                      local_d8.i = local_b8.i;
                    } while (bVar5);
                  }
                  n = (integer *)local_58;
                  lVar8 = local_60;
                  if (cVar3 == 'N') {
                    d_cnjg(&local_98,a + (int)uVar15 * (*lda + 1));
                    pdVar18 = &local_98;
                    goto LAB_0011b447;
                  }
                }
                x[uVar15].r = local_b8.r;
                x[uVar15].i = local_b8.i;
                iVar22 = iVar22 + -1;
                bVar5 = (long)uVar12 < 2;
                uVar12 = uVar15;
                if (bVar5) {
                  return;
                }
              } while( true );
            }
            if (iVar19 != 1) {
              local_40 = x + (long)local_e0 + -1;
              local_48 = &a->i;
              uVar12 = 1;
              lVar9 = 0;
              lVar8 = 0;
              iVar13 = local_e0;
              do {
                local_60 = (long)iVar13 * 0x10;
                lVar10 = uVar12 - 1;
                local_b8.r = x[(long)iVar13 + -1].r;
                local_b8.i = x[(long)iVar13 + -1].i;
                if ((char)local_80 == 'T') {
                  if (1 < uVar12) {
                    lVar21 = 0;
                    pdVar18 = local_40;
                    do {
                      dVar24 = *(double *)((long)local_48 + lVar21 + *lda * lVar9 + -8);
                      dVar25 = *(double *)((long)local_48 + lVar21 + *lda * lVar9);
                      local_98.r = dVar24 * pdVar18->r + pdVar18->i * -dVar25;
                      local_98.i = dVar24 * pdVar18->i + pdVar18->r * dVar25;
                      local_b8.r = local_b8.r - local_98.r;
                      local_b8.i = local_b8.i - local_98.i;
                      pdVar18 = pdVar18 + iVar19;
                      lVar21 = lVar21 + 0x10;
                      local_d8.r = local_b8.r;
                      local_d8.i = local_b8.i;
                      local_68 = (double *)lVar10;
                    } while (lVar9 != lVar21);
                  }
                  uVar15 = uVar12;
                  if (cVar3 == 'N') {
                    pdVar18 = a + (int)lVar10 * (*lda + 1);
LAB_0011b841:
                    z_div(&local_d8,&local_b8,pdVar18);
                    uVar15 = uVar12;
                    a = local_a8;
                    lda = local_a0;
                    local_b8.r = local_d8.r;
                    local_b8.i = local_d8.i;
                  }
                }
                else {
                  local_50 = (double *)CONCAT44(local_50._4_4_,iVar13);
                  local_68 = (double *)lVar10;
                  local_38 = uVar12;
                  if (1 < uVar12) {
                    lVar21 = 0;
                    iVar19 = local_e0;
                    do {
                      d_cnjg(&local_78,a + (long)*lda * (long)(int)lVar8 + lVar21);
                      dVar24 = x[(long)iVar19 + -1].r;
                      dVar25 = x[(long)iVar19 + -1].i;
                      local_98.r = local_78.r * dVar24 + dVar25 * -local_78.i;
                      local_98.i = local_78.r * dVar25 + dVar24 * local_78.i;
                      local_b8.r = local_b8.r - local_98.r;
                      local_b8.i = local_b8.i - local_98.i;
                      iVar19 = iVar19 + *incx;
                      lVar21 = lVar21 + 1;
                      a = local_a8;
                      lda = local_a0;
                      local_d8.r = local_b8.r;
                      local_d8.i = local_b8.i;
                    } while (lVar8 != lVar21);
                  }
                  uVar12 = local_38;
                  n = (integer *)local_58;
                  uVar15 = local_38;
                  iVar13 = (int)local_50;
                  if (cVar3 == 'N') {
                    pdVar18 = &local_98;
                    d_cnjg(pdVar18,a + (int)local_68 * (*lda + 1));
                    iVar13 = (int)local_50;
                    goto LAB_0011b841;
                  }
                }
                pdVar20 = (double *)((long)&x[-1].r + local_60);
                *pdVar20 = local_b8.r;
                pdVar20[1] = local_b8.i;
                iVar19 = *incx;
                iVar13 = iVar13 + iVar19;
                uVar12 = uVar15 + 1;
                lVar8 = lVar8 + 1;
                lVar9 = lVar9 + 0x10;
                if ((long)*n <= (long)uVar15) {
                  return;
                }
              } while( true );
            }
            lVar8 = 0;
            pdVar18 = a;
            uVar12 = 1;
            do {
              lVar9 = uVar12 - 1;
              local_b8.r = x[lVar9].r;
              local_b8.i = x[lVar9].i;
              if ((char)local_80 == 'T') {
                if (1 < uVar12) {
                  lVar10 = 0;
                  do {
                    dVar24 = *(double *)((long)&a->r + lVar10 + *lda * lVar8);
                    dVar25 = *(double *)((long)&a->i + lVar10 + *lda * lVar8);
                    pdVar20 = (double *)((long)&x->r + lVar10);
                    dVar6 = *pdVar20;
                    dVar7 = pdVar20[1];
                    local_98.r = dVar24 * dVar6 + dVar7 * -dVar25;
                    local_98.i = dVar24 * dVar7 + dVar6 * dVar25;
                    local_b8.r = local_b8.r - local_98.r;
                    local_b8.i = local_b8.i - local_98.i;
                    lVar10 = lVar10 + 0x10;
                    local_d8.r = local_b8.r;
                    local_d8.i = local_b8.i;
                  } while (lVar8 != lVar10);
                }
                if (cVar3 == 'N') {
                  pdVar11 = pdVar18 + (int)lVar9 * (*lda + 1);
LAB_0011b0c9:
                  z_div(&local_d8,&local_b8,pdVar11);
                  pdVar18 = local_a8;
                  lda = local_a0;
                  local_b8.r = local_d8.r;
                  local_b8.i = local_d8.i;
                }
              }
              else {
                if (1 < uVar12) {
                  lVar10 = 0;
                  do {
                    d_cnjg(&local_78,(doublecomplex *)((long)&pdVar18->r + lVar10 + *lda * lVar8));
                    pdVar20 = (double *)((long)&x->r + lVar10);
                    dVar24 = *pdVar20;
                    dVar25 = pdVar20[1];
                    local_98.r = local_78.r * dVar24 + dVar25 * -local_78.i;
                    local_98.i = local_78.r * dVar25 + dVar24 * local_78.i;
                    local_b8.r = local_b8.r - local_98.r;
                    local_b8.i = local_b8.i - local_98.i;
                    lVar10 = lVar10 + 0x10;
                    pdVar18 = local_a8;
                    lda = local_a0;
                    local_d8.r = local_b8.r;
                    local_d8.i = local_b8.i;
                  } while (lVar8 != lVar10);
                }
                if (cVar3 == 'N') {
                  pdVar11 = &local_98;
                  d_cnjg(pdVar11,pdVar18 + (int)lVar9 * (*lda + 1));
                  goto LAB_0011b0c9;
                }
              }
              x[lVar9].r = local_b8.r;
              x[lVar9].i = local_b8.i;
              lVar8 = lVar8 + 0x10;
              bVar5 = (long)(int)*local_58 <= (long)uVar12;
              uVar12 = uVar12 + 1;
              if (bVar5) {
                return;
              }
            } while( true );
          }
          local_bc = 8;
        }
      }
      else {
        local_bc = 3;
      }
    }
    else {
      local_bc = 2;
    }
  }
  else {
    local_bc = 1;
  }
  input_error("ZTRSV ",&local_bc);
  return;
}

Assistant:

void ztrsv_(char *uplo, char *trans, char *diag, integer *n, 
	doublecomplex *a, integer *lda, doublecomplex *x, integer *incx)
{

    /* System generated locals */

    doublecomplex z__1, z__2, z__3;

    /* Builtin functions */
    void z_div(doublecomplex *, doublecomplex *, doublecomplex *), d_cnjg(
	    doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("ZTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0. || X(j).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(j), &A(j,j));
			    X(j).r = z__1.r, X(j).i = z__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(i).r - z__2.r, z__1.i = X(i).i - 
				    z__2.i;
			    X(i).r = z__1.r, X(i).i = z__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0. || X(jx).i != 0.) {
			if (nounit) {
			    z_div(&z__1, &X(jx), &A(j,j));
			    X(jx).r = z__1.r, X(jx).i = z__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    z__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    z__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    z__1.r = X(ix).r - z__2.r, z__1.i = X(ix).i - 
				    z__2.i;
			    X(ix).r = z__1.r, X(ix).i = z__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L90: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L100: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, z__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L150: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(i).r - z__3.i * X(i).i, 
				    z__2.i = z__3.r * X(i).i + z__3.i * X(
				    i).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
/* L160: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    z__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, z__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    z_div(&z__1, &temp, &A(j,j));
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    d_cnjg(&z__3, &A(i,j));
			    z__2.r = z__3.r * X(ix).r - z__3.i * X(ix).i, 
				    z__2.i = z__3.r * X(ix).i + z__3.i * X(
				    ix).r;
			    z__1.r = temp.r - z__2.r, z__1.i = temp.i - 
				    z__2.i;
			    temp.r = z__1.r, temp.i = z__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    d_cnjg(&z__2, &A(j,j));
			    z_div(&z__1, &temp, &z__2);
			    temp.r = z__1.r, temp.i = z__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of ZTRSV . */

}